

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

float Assimp::FBX::PropertyGet<float>(PropertyTable *in,string *name,bool *result,bool useTemplate)

{
  PropertyTable *this;
  TypedProperty<float> *this_00;
  float *pfVar1;
  TypedProperty<float> *tprop;
  PropertyTable *templ;
  Property *prop;
  bool useTemplate_local;
  bool *result_local;
  string *name_local;
  PropertyTable *in_local;
  
  templ = (PropertyTable *)PropertyTable::Get(in,name);
  if (templ == (PropertyTable *)0x0) {
    if (!useTemplate) {
      *result = false;
      return 0.0;
    }
    this = PropertyTable::TemplateProps(in);
    if (this == (PropertyTable *)0x0) {
      *result = false;
      return 0.0;
    }
    templ = (PropertyTable *)PropertyTable::Get(this,name);
    if (templ == (PropertyTable *)0x0) {
      *result = false;
      return 0.0;
    }
  }
  this_00 = Property::As<Assimp::FBX::TypedProperty<float>>((Property *)templ);
  if (this_00 == (TypedProperty<float> *)0x0) {
    *result = false;
    in_local._4_4_ = 0.0;
  }
  else {
    *result = true;
    pfVar1 = TypedProperty<float>::Value(this_00);
    in_local._4_4_ = *pfVar1;
  }
  return in_local._4_4_;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, bool& result, bool useTemplate=false ) {
    const Property* prop = in.Get(name);
    if( nullptr == prop) {
        if ( ! useTemplate ) {
            result = false;
            return T();
        }
        const PropertyTable* templ = in.TemplateProps();
        if ( nullptr == templ ) {
            result = false;
            return T();
        }
        prop = templ->Get(name);
        if ( nullptr == prop ) {
            result = false;
            return T();
        }
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        result = false;
        return T();
    }

    result = true;
    return tprop->Value();
}